

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckedArithmetic.h
# Opt level: O2

unsigned_long Imf_2_5::uiAdd<unsigned_long>(unsigned_long a,unsigned_long b)

{
  OverflowExc *this;
  
  if (!CARRY8(a,b)) {
    return a + b;
  }
  this = (OverflowExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::OverflowExc::OverflowExc(this,"Integer addition overflow.");
  __cxa_throw(this,&Iex_2_5::OverflowExc::typeinfo,Iex_2_5::OverflowExc::~OverflowExc);
}

Assistant:

T
uiAdd (T a, T b)
{
    //
    // Unsigned integer addition
    //

    IMF_STATIC_ASSERT (!std::numeric_limits<T>::is_signed &&
                        std::numeric_limits<T>::is_integer);

    if (a > std::numeric_limits<T>::max() - b)
        throw IEX_NAMESPACE::OverflowExc ("Integer addition overflow.");

    return a + b;
}